

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libspirv.cpp
# Opt level: O0

bool __thiscall
spvtools::SpirvTools::Assemble
          (SpirvTools *this,char *text,size_t text_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,uint32_t options)

{
  spv_result_t sVar1;
  pointer pIVar2;
  spv_binary psStack_38;
  spv_result_t status;
  spv_binary spvbinary;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvStack_28;
  uint32_t options_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  size_t text_size_local;
  char *text_local;
  SpirvTools *this_local;
  
  psStack_38 = (spv_binary)0x0;
  spvbinary._4_4_ = options;
  pvStack_28 = (vector<unsigned_int,std::allocator<unsigned_int>> *)binary;
  binary_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)text_size;
  text_size_local = (size_t)text;
  text_local = (char *)this;
  pIVar2 = std::
           unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
           ::operator->(&this->impl_);
  sVar1 = spvTextToBinaryWithOptions
                    (pIVar2->context,(char *)text_size_local,(size_t)binary_local,spvbinary._4_4_,
                     &stack0xffffffffffffffc8,(spv_diagnostic *)0x0);
  if (sVar1 == SPV_SUCCESS) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::assign<unsigned_int*,void>
              (pvStack_28,psStack_38->code,psStack_38->code + psStack_38->wordCount);
  }
  spvBinaryDestroy(psStack_38);
  return sVar1 == SPV_SUCCESS;
}

Assistant:

bool SpirvTools::Assemble(const char* text, const size_t text_size,
                          std::vector<uint32_t>* binary,
                          uint32_t options) const {
  spv_binary spvbinary = nullptr;
  spv_result_t status = spvTextToBinaryWithOptions(
      impl_->context, text, text_size, options, &spvbinary, nullptr);
  if (status == SPV_SUCCESS) {
    binary->assign(spvbinary->code, spvbinary->code + spvbinary->wordCount);
  }
  spvBinaryDestroy(spvbinary);
  return status == SPV_SUCCESS;
}